

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worm.c
# Opt level: O2

void cutworm(monst *worm,xchar x,xchar y,obj *weap)

{
  byte bVar1;
  wseg *tail;
  level *lev;
  uint uVar2;
  int iVar3;
  int iVar4;
  monst *worm_00;
  char *pcVar5;
  char *line;
  uint uVar6;
  wseg *pwVar7;
  byte bVar8;
  
  bVar1 = worm->wormno;
  if ((bVar1 != 0) && ((worm->mx != x || (worm->my != y)))) {
    uVar2 = rnd(0x14);
    uVar6 = uVar2;
    if ((weap != (obj *)0x0) &&
       ((weap->oclass == '\x02' &&
        (uVar6 = uVar2 + 10, 9 < (byte)(objects[weap->otyp].oc_subtyp - 1U))))) {
      uVar6 = uVar2;
    }
    if (0x10 < uVar6) {
      uVar6 = (uint)x;
      tail = level->wtails[bVar1];
      pwVar7 = tail;
      while ((pwVar7->wx != x || (pwVar7->wy != y))) {
        pwVar7 = pwVar7->nseg;
        if (pwVar7 == (wseg *)0x0) {
          warning("cutworm: no segment at (%d,%d)",(ulong)uVar6,(ulong)(uint)(int)y);
          return;
        }
      }
      if (pwVar7 != tail) {
        level->wtails[bVar1] = pwVar7->nseg;
        pwVar7->nseg = (wseg *)0x0;
        uVar2 = mt_random();
        lev = level;
        if ((uVar2 % 3 == 0) && (iVar3 = get_wormno(level), iVar3 != 0)) {
          remove_monster(lev,uVar6,(int)y);
          worm_00 = clone_mon(worm,x,y);
          if (worm_00 != (monst *)0x0) {
            worm_00->wormno = (uchar)iVar3;
            bVar1 = worm->m_lev;
            bVar8 = 3;
            if (3 < bVar1 - 2) {
              bVar8 = (byte)(bVar1 - 2);
            }
            if (bVar1 < 4) {
              bVar8 = bVar1;
            }
            worm->m_lev = bVar8;
            worm_00->m_lev = bVar8;
            iVar4 = dice((uint)bVar8,uVar6);
            worm_00->mhp = iVar4;
            worm_00->mhpmax = iVar4;
            if (3 < worm->m_lev) {
              iVar4 = dice((uint)worm->m_lev,uVar6);
              worm->mhpmax = iVar4;
              if (iVar4 < worm->mhp) {
                worm->mhp = iVar4;
              }
            }
            level->wtails[iVar3] = tail;
            level->wheads[iVar3] = pwVar7;
            level->wgrowtime[iVar3] = 0;
            place_wsegs(worm_00);
            if (flags.mon_moving == '\0') {
              pcVar5 = mon_nam(worm);
              line = "You cut %s in half.";
            }
            else {
              pcVar5 = Monnam(worm);
              line = "%s is cut in half.";
            }
            pline(line,pcVar5);
            return;
          }
        }
        cutoff(worm,tail);
        return;
      }
      shrink_worm((uint)bVar1);
      return;
    }
  }
  return;
}

Assistant:

void cutworm(struct monst *worm, xchar x, xchar y, struct obj *weap)
{
    struct wseg  *curr, *new_tail;
    struct monst *new_worm;
    int wnum = worm->wormno;
    int cut_chance, new_wnum;

    if (!wnum) return;	/* no worm */

    if (x == worm->mx && y == worm->my) return;		/* hit on head */

    /* cutting goes best with a bladed weapon */
    cut_chance = rnd(20);	/* Normally  1-16 does not cut */
				/* Normally 17-20 does */

    if (weap && is_blade(weap))	/* With a blade 1- 6 does not cut */
	cut_chance += 10;	/*		7-20 does */

    if (cut_chance < 17) return;	/* not good enough */

    /* Find the segment that was attacked. */
    curr = level->wtails[wnum];

    while ( (curr->wx != x) || (curr->wy != y) ) {
	curr = curr->nseg;
	if (!curr) {
	    warning("cutworm: no segment at (%d,%d)", x, y);
	    return;
	}
    }

    /* If this is the tail segment, then the worm just loses it. */
    if (curr == level->wtails[wnum]) {
	shrink_worm(wnum);
	return;
    }

    /*
     *  Split the worm.  The tail for the new worm is the old worm's tail.
     *  The tail for the old worm is the segment that follows "curr",
     *  and "curr" becomes the dummy segment under the new head.
     */
    new_tail = level->wtails[wnum];
    level->wtails[wnum] = curr->nseg;
    curr->nseg = NULL;	/* split the worm */

    /*
     *  At this point, the old worm is correct.  Any new worm will have
     *  it's head at "curr" and its tail at "new_tail".
     */

    /* Sometimes the tail end dies. */
    if (rn2(3) || !(new_wnum = get_wormno(level))) {
	cutoff(worm, new_tail);
	return;
    }

    remove_monster(level, x, y);		/* clone_mon puts new head here */
    if (!(new_worm = clone_mon(worm, x, y))) {
	cutoff(worm, new_tail);
	return;
    }
    new_worm->wormno = new_wnum;	/* affix new worm number */

    /* Devalue the monster level of both halves of the worm. */
    worm->m_lev = ((unsigned)worm->m_lev <= 3) ?
		   (unsigned)worm->m_lev : max((unsigned)worm->m_lev - 2, 3);
    new_worm->m_lev = worm->m_lev;

    /* Calculate the mhp on the new_worm for the (lower) monster level. */
    new_worm->mhpmax = new_worm->mhp = dice((int)new_worm->m_lev, 8);

    /* Calculate the mhp on the old worm for the (lower) monster level. */
    if (worm->m_lev > 3) {
	worm->mhpmax = dice((int)worm->m_lev, 8);
	if (worm->mhpmax < worm->mhp) worm->mhp = worm->mhpmax;
    }

    level->wtails[new_wnum] = new_tail;	/* We've got all the info right now */
    level->wheads[new_wnum] = curr;	/* so we can do this faster than    */
    level->wgrowtime[new_wnum] = 0L;	/* trying to call initworm().       */

    /* Place the new monster at all the segment locations. */
    place_wsegs(new_worm);

    if (flags.mon_moving)
	pline("%s is cut in half.", Monnam(worm));
    else
	pline("You cut %s in half.", mon_nam(worm));
}